

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O2

void __thiscall
ON_SHA1::Internal_SwapBigEndianUpdate(ON_SHA1 *this,void *buffer,ON__UINT64 sizeof_buffer)

{
  undefined1 *puVar1;
  endian eVar2;
  ON__UINT64 sizeof_buffer_00;
  void *pvVar3;
  void *pvVar4;
  char *p0;
  uchar reversed_buffer [32];
  undefined1 local_48 [40];
  
  eVar2 = ON::Endian();
  if (((sizeof_buffer == 0) || (buffer == (void *)0x0)) || (eVar2 != big_endian)) {
    AccumulateBytes(this,buffer,sizeof_buffer);
    return;
  }
  pvVar3 = (void *)(sizeof_buffer + (long)buffer);
  do {
    if (pvVar3 <= buffer) {
      return;
    }
    pvVar4 = pvVar3;
    for (sizeof_buffer_00 = 0; pvVar3 = pvVar4, sizeof_buffer_00 != 0x20;
        sizeof_buffer_00 = sizeof_buffer_00 + 1) {
      puVar1 = (undefined1 *)((long)pvVar4 - 1);
      pvVar4 = (void *)((long)pvVar4 - 1);
      local_48[sizeof_buffer_00] = *puVar1;
      pvVar3 = buffer;
      if (pvVar4 == buffer) break;
    }
    AccumulateBytes(this,local_48,sizeof_buffer_00);
  } while( true );
}

Assistant:

void ON_SHA1::Internal_SwapBigEndianUpdate(
  const void* buffer,
  ON__UINT64 sizeof_buffer
)
{
  if (ON::Endian() == ON::endian::big_endian && nullptr != buffer && sizeof_buffer > 0)
  {
    unsigned char reversed_buffer[32];
    const ON__UINT64 reversed_buffer_capacity = (ON__UINT64)sizeof(reversed_buffer);
    ON__UINT64 sizeof_reversed_buffer;
    const char* p0 = (const char*)buffer;
    const char* p1 = p0 + sizeof_buffer;
    while (p0 < p1)
    {
      for (sizeof_reversed_buffer = 0; sizeof_reversed_buffer < reversed_buffer_capacity; sizeof_reversed_buffer++)
      {
        reversed_buffer[sizeof_reversed_buffer] = *--p1;
        if (p0 == p1)
          break;
      }
      AccumulateBytes( reversed_buffer, sizeof_reversed_buffer );
    }
  }
  else
  {
    AccumulateBytes(buffer, sizeof_buffer);
  }
}